

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMove6<(moira::Instr)71,(moira::Mode)10,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)6,_(moira::Size)2> dst;
  Ea<(moira::Mode)10,_(moira::Size)2> src;
  Ea<(moira::Mode)6,_(moira::Size)2> EStack_58;
  Ea<(moira::Mode)10,_(moira::Size)2> local_44;
  
  Op<(moira::Mode)10,(moira::Size)2>(&local_44,this,op & 7,addr);
  Op<(moira::Mode)6,(moira::Size)2>(&EStack_58,this,op >> 9 & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(this->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,&local_44);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,&EStack_58);
  return;
}

Assistant:

void
Moira::dasmMove6(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_IX,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}